

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

int __thiscall
Fl_Text_Buffer::search_backward
          (Fl_Text_Buffer *this,int startPos,char *searchString,int *foundPos,int matchCase)

{
  int iVar1;
  int iVar2;
  uint ucs;
  uint ucs_00;
  int iVar3;
  long lVar4;
  char *__s2;
  char *pcVar5;
  int local_48;
  int l;
  char *local_40;
  int *local_38;
  
  if (searchString != (char *)0x0) {
    local_40 = searchString;
    if (matchCase == 0) {
      local_38 = foundPos;
      for (; pcVar5 = local_40, iVar3 = startPos, -1 < startPos; startPos = prev_char(this,startPos)
          ) {
        while( true ) {
          foundPos = local_38;
          local_48 = startPos;
          if (*pcVar5 == '\0') goto LAB_001cc367;
          ucs = char_at(this,iVar3);
          ucs_00 = fl_utf8decode(pcVar5,(char *)0x0,&l);
          iVar1 = fl_tolower(ucs);
          iVar2 = fl_tolower(ucs_00);
          if (iVar1 != iVar2) break;
          lVar4 = (long)l;
          iVar3 = next_char(this,iVar3);
          pcVar5 = pcVar5 + lVar4;
        }
      }
    }
    else {
      for (; pcVar5 = local_40, iVar3 = startPos, -1 < startPos; startPos = prev_char(this,startPos)
          ) {
        do {
          local_48 = startPos;
          if (*pcVar5 == '\0') {
LAB_001cc367:
            *foundPos = local_48;
            return 1;
          }
          iVar1 = fl_utf8len1(*pcVar5);
          __s2 = this->mBuf + iVar3 + ((long)this->mGapEnd - (long)this->mGapStart);
          if (iVar3 < this->mGapStart) {
            __s2 = this->mBuf + iVar3;
          }
          iVar2 = bcmp(pcVar5,__s2,(long)iVar1);
          pcVar5 = pcVar5 + iVar1;
          iVar3 = iVar1 + iVar3;
        } while (iVar2 == 0);
      }
    }
  }
  return 0;
}

Assistant:

int Fl_Text_Buffer::search_backward(int startPos, const char *searchString,
				    int *foundPos, int matchCase) const 
{
  IS_UTF8_ALIGNED2(this, (startPos))
  IS_UTF8_ALIGNED(searchString)
  
  if (!searchString)
    return 0;
  int bp;
  const char *sp;
  if (matchCase) {
    while (startPos >= 0) {
      bp = startPos;
      sp = searchString;
      for (;;) {
        char c = *sp;
        // we reached the end of the "needle", so we found the string!
        if (!c) {
          *foundPos = startPos;
          return 1;
        }
        int l = fl_utf8len1(c);
        if (memcmp(sp, address(bp), l))
          break;
        sp += l; bp += l;
      }
      startPos = prev_char(startPos);
    }
  } else {
    while (startPos >= 0) {
      bp = startPos;
      sp = searchString;
      for (;;) {
        // we reached the end of the "needle", so we found the string!
        if (!*sp) {
          *foundPos = startPos;
          return 1;
        }
        int l;
        unsigned int b = char_at(bp);
        unsigned int s = fl_utf8decode(sp, 0, &l);
        if (fl_tolower(b)!=fl_tolower(s))
          break;
        sp += l; 
        bp = next_char(bp);
      }
      startPos = prev_char(startPos);
    }
  }  
  return 0;
}